

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O3

void Abc_GraphPathPrint4(int *pBuffer,Vec_Int_t *vEdges)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 *puVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 *puVar9;
  uint uVar10;
  long lVar11;
  undefined1 uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar20;
  int iVar21;
  undefined1 auVar18 [16];
  int iVar22;
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar43;
  int iVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  char Box [13] [13];
  undefined1 local_e8;
  undefined1 local_e7 [183];
  long lVar42;
  
  puVar9 = &local_e8;
  uVar1 = vEdges->nSize;
  puVar4 = local_e7;
  lVar6 = 0;
  do {
    lVar11 = 0;
    auVar34 = _DAT_0093d210;
    do {
      auVar44 = auVar34 ^ _DAT_0093d220;
      auVar49._0_4_ = -(uint)(auVar44._0_4_ < -0x7ffffff3);
      auVar49._4_4_ = -(uint)(auVar44._4_4_ < -0x80000000);
      auVar49._8_4_ = -(uint)(auVar44._8_4_ < -0x7ffffff3);
      iVar17 = auVar44._12_4_;
      auVar49._12_4_ = -(uint)(iVar17 < -0x80000000);
      auVar44._0_4_ = -(uint)(auVar44._4_4_ == -0x80000000);
      auVar44._4_4_ = 0;
      auVar44._8_4_ = -(uint)(iVar17 == -0x80000000);
      auVar44._12_4_ = -(uint)(iVar17 == -0x80000000);
      if ((auVar44 & auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar12 = 0x20;
        if ((((uint)lVar11 | (uint)lVar6) & 3) == 0) {
          uVar12 = 0x2a;
        }
        puVar4[lVar11 + -1] = uVar12;
      }
      if ((auVar44 & auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar4[lVar11] = 0x20;
      }
      lVar11 = lVar11 + 2;
      lVar42 = auVar34._8_8_;
      auVar34._0_8_ = auVar34._0_8_ + 2;
      auVar34._8_8_ = lVar42 + 2;
    } while (lVar11 != 0xe);
    lVar6 = lVar6 + 1;
    puVar4 = puVar4 + 0xd;
  } while (lVar6 != 0xd);
  if (1 < (int)uVar1) {
    uVar13 = 0;
    auVar34 = _DAT_0093d220;
    auVar44 = _DAT_009b63a0;
    auVar54 = _DAT_009b63b0;
    auVar55 = _DAT_009b63c0;
    auVar56 = _DAT_009b63d0;
    auVar57 = _DAT_009b63e0;
    auVar58 = _DAT_009b63f0;
    auVar59 = _DAT_0093e4e0;
    do {
      if ((ulong)uVar1 <= uVar13 * 2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      uVar5 = vEdges->pArray[uVar13 * 2];
      uVar2 = vEdges->pArray[uVar13 * 2 + 1];
      uVar3 = uVar5 + 3;
      if (-1 < (int)uVar5) {
        uVar3 = uVar5;
      }
      uVar10 = uVar2 + 3;
      if (-1 < (int)uVar2) {
        uVar10 = uVar2;
      }
      if (pBuffer[uVar13] != 0) {
        uVar3 = uVar3 & 0xfffffffc;
        uVar7 = (int)uVar5 % 4 << 2;
        uVar10 = uVar10 & 0xfffffffc;
        uVar5 = ((int)uVar2 % 4) * 4;
        if (uVar3 == uVar10) {
          if ((int)(uVar7 | 1) < (int)uVar5) {
            memset(local_e7 + (long)(int)uVar7 + (long)(int)uVar3 * 0xd,0x2d,(ulong)(~uVar7 + uVar5)
                  );
            auVar34 = _DAT_0093d220;
            auVar44 = _DAT_009b63a0;
            auVar54 = _DAT_009b63b0;
            auVar55 = _DAT_009b63c0;
            auVar56 = _DAT_009b63d0;
            auVar57 = _DAT_009b63e0;
            auVar58 = _DAT_009b63f0;
            auVar59 = _DAT_0093e4e0;
          }
        }
        else {
          if (uVar7 != uVar5) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPath.c"
                          ,0xd2,"void Abc_GraphPathPrint4(int *, Vec_Int_t *)");
          }
          if ((int)(uVar3 | 1) < (int)uVar10) {
            lVar6 = (long)(int)uVar10 + (long)(int)~uVar3 + -1;
            auVar14._8_4_ = (int)lVar6;
            auVar14._0_8_ = lVar6;
            auVar14._12_4_ = (int)((ulong)lVar6 >> 0x20);
            puVar4 = &stack0xffffffffffffffe8 + (long)(int)uVar3 * 0xd + (long)(int)uVar7;
            uVar8 = 0;
            do {
              auVar15._8_4_ = (int)uVar8;
              auVar15._0_8_ = uVar8;
              auVar15._12_4_ = (int)(uVar8 >> 0x20);
              auVar18 = auVar14 ^ auVar34;
              auVar23 = (auVar15 | _DAT_0093d210) ^ auVar34;
              iVar17 = auVar18._0_4_;
              iVar43 = -(uint)(iVar17 < auVar23._0_4_);
              iVar20 = auVar18._4_4_;
              auVar24._4_4_ = -(uint)(iVar20 < auVar23._4_4_);
              iVar21 = auVar18._8_4_;
              iVar48 = -(uint)(iVar21 < auVar23._8_4_);
              iVar22 = auVar18._12_4_;
              auVar24._12_4_ = -(uint)(iVar22 < auVar23._12_4_);
              auVar35._4_4_ = iVar43;
              auVar35._0_4_ = iVar43;
              auVar35._8_4_ = iVar48;
              auVar35._12_4_ = iVar48;
              auVar49 = pshuflw(auVar49,auVar35,0xe8);
              auVar18._4_4_ = -(uint)(auVar23._4_4_ == iVar20);
              auVar18._12_4_ = -(uint)(auVar23._12_4_ == iVar22);
              auVar18._0_4_ = auVar18._4_4_;
              auVar18._8_4_ = auVar18._12_4_;
              auVar50 = pshuflw(in_XMM7,auVar18,0xe8);
              auVar24._0_4_ = auVar24._4_4_;
              auVar24._8_4_ = auVar24._12_4_;
              auVar23 = pshuflw(auVar49,auVar24,0xe8);
              auVar51._8_4_ = 0xffffffff;
              auVar51._0_8_ = 0xffffffffffffffff;
              auVar51._12_4_ = 0xffffffff;
              auVar49 = (auVar23 | auVar50 & auVar49) ^ auVar51;
              auVar49 = packssdw(auVar49,auVar49);
              if ((auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar4[-0xc3] = 0x7c;
              }
              auVar24 = auVar18 & auVar35 | auVar24;
              auVar49 = packssdw(auVar24,auVar24);
              auVar49 = packssdw(auVar49 ^ auVar51,auVar49 ^ auVar51);
              auVar49 = packsswb(auVar49,auVar49);
              if ((auVar49._0_4_ >> 8 & 1) != 0) {
                puVar4[-0xb6] = 0x7c;
              }
              auVar49 = (auVar15 | auVar59) ^ auVar34;
              iVar43 = -(uint)(iVar17 < auVar49._0_4_);
              auVar45._4_4_ = -(uint)(iVar20 < auVar49._4_4_);
              iVar48 = -(uint)(iVar21 < auVar49._8_4_);
              auVar45._12_4_ = -(uint)(iVar22 < auVar49._12_4_);
              auVar23._4_4_ = iVar43;
              auVar23._0_4_ = iVar43;
              auVar23._8_4_ = iVar48;
              auVar23._12_4_ = iVar48;
              auVar50._4_4_ = -(uint)(auVar49._4_4_ == iVar20);
              auVar50._12_4_ = -(uint)(auVar49._12_4_ == iVar22);
              auVar50._0_4_ = auVar50._4_4_;
              auVar50._8_4_ = auVar50._12_4_;
              auVar45._0_4_ = auVar45._4_4_;
              auVar45._8_4_ = auVar45._12_4_;
              auVar49 = auVar50 & auVar23 | auVar45;
              auVar49 = packssdw(auVar49,auVar49);
              auVar49 = packssdw(auVar49 ^ auVar51,auVar49 ^ auVar51);
              auVar49 = packsswb(auVar49,auVar49);
              if ((auVar49._0_4_ >> 0x10 & 1) != 0) {
                puVar4[-0xa9] = 0x7c;
              }
              auVar18 = pshufhw(auVar23,auVar23,0x84);
              auVar24 = pshufhw(auVar50,auVar50,0x84);
              auVar23 = pshufhw(auVar18,auVar45,0x84);
              auVar18 = (auVar23 | auVar24 & auVar18) ^ auVar51;
              auVar18 = packssdw(auVar18,auVar18);
              auVar18 = packsswb(auVar18,auVar18);
              if ((auVar18._0_4_ >> 0x18 & 1) != 0) {
                puVar4[-0x9c] = 0x7c;
              }
              auVar18 = (auVar15 | auVar58) ^ auVar34;
              iVar43 = -(uint)(iVar17 < auVar18._0_4_);
              auVar26._4_4_ = -(uint)(iVar20 < auVar18._4_4_);
              iVar48 = -(uint)(iVar21 < auVar18._8_4_);
              auVar26._12_4_ = -(uint)(iVar22 < auVar18._12_4_);
              auVar36._4_4_ = iVar43;
              auVar36._0_4_ = iVar43;
              auVar36._8_4_ = iVar48;
              auVar36._12_4_ = iVar48;
              auVar49 = pshuflw(auVar49,auVar36,0xe8);
              auVar25._4_4_ = -(uint)(auVar18._4_4_ == iVar20);
              auVar25._12_4_ = -(uint)(auVar18._12_4_ == iVar22);
              auVar25._0_4_ = auVar25._4_4_;
              auVar25._8_4_ = auVar25._12_4_;
              auVar23 = pshuflw(auVar51,auVar25,0xe8);
              auVar26._0_4_ = auVar26._4_4_;
              auVar26._8_4_ = auVar26._12_4_;
              auVar18 = pshuflw(auVar49,auVar26,0xe8);
              auVar52._8_4_ = 0xffffffff;
              auVar52._0_8_ = 0xffffffffffffffff;
              auVar52._12_4_ = 0xffffffff;
              auVar49 = (auVar18 | auVar23 & auVar49) ^ auVar52;
              auVar49 = packssdw(auVar49,auVar49);
              auVar49 = packsswb(auVar49,auVar49);
              if ((auVar49 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar4[-0x8f] = 0x7c;
              }
              auVar26 = auVar25 & auVar36 | auVar26;
              auVar49 = packssdw(auVar26,auVar26);
              auVar49 = packssdw(auVar49 ^ auVar52,auVar49 ^ auVar52);
              auVar49 = packsswb(auVar49,auVar49);
              if ((auVar49._4_2_ >> 8 & 1) != 0) {
                puVar4[-0x82] = 0x7c;
              }
              auVar49 = (auVar15 | auVar57) ^ auVar34;
              iVar43 = -(uint)(iVar17 < auVar49._0_4_);
              auVar46._4_4_ = -(uint)(iVar20 < auVar49._4_4_);
              iVar48 = -(uint)(iVar21 < auVar49._8_4_);
              auVar46._12_4_ = -(uint)(iVar22 < auVar49._12_4_);
              auVar27._4_4_ = iVar43;
              auVar27._0_4_ = iVar43;
              auVar27._8_4_ = iVar48;
              auVar27._12_4_ = iVar48;
              auVar37._4_4_ = -(uint)(auVar49._4_4_ == iVar20);
              auVar37._12_4_ = -(uint)(auVar49._12_4_ == iVar22);
              auVar37._0_4_ = auVar37._4_4_;
              auVar37._8_4_ = auVar37._12_4_;
              auVar46._0_4_ = auVar46._4_4_;
              auVar46._8_4_ = auVar46._12_4_;
              auVar49 = auVar37 & auVar27 | auVar46;
              auVar49 = packssdw(auVar49,auVar49);
              auVar49 = packssdw(auVar49 ^ auVar52,auVar49 ^ auVar52);
              auVar49 = packsswb(auVar49,auVar49);
              if ((auVar49 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar4[-0x75] = 0x7c;
              }
              auVar18 = pshufhw(auVar27,auVar27,0x84);
              auVar24 = pshufhw(auVar37,auVar37,0x84);
              auVar23 = pshufhw(auVar18,auVar46,0x84);
              auVar18 = (auVar23 | auVar24 & auVar18) ^ auVar52;
              auVar18 = packssdw(auVar18,auVar18);
              auVar18 = packsswb(auVar18,auVar18);
              if ((auVar18._6_2_ >> 8 & 1) != 0) {
                puVar4[-0x68] = 0x7c;
              }
              auVar18 = (auVar15 | auVar56) ^ auVar34;
              iVar43 = -(uint)(iVar17 < auVar18._0_4_);
              auVar29._4_4_ = -(uint)(iVar20 < auVar18._4_4_);
              iVar48 = -(uint)(iVar21 < auVar18._8_4_);
              auVar29._12_4_ = -(uint)(iVar22 < auVar18._12_4_);
              auVar38._4_4_ = iVar43;
              auVar38._0_4_ = iVar43;
              auVar38._8_4_ = iVar48;
              auVar38._12_4_ = iVar48;
              auVar49 = pshuflw(auVar49,auVar38,0xe8);
              auVar28._4_4_ = -(uint)(auVar18._4_4_ == iVar20);
              auVar28._12_4_ = -(uint)(auVar18._12_4_ == iVar22);
              auVar28._0_4_ = auVar28._4_4_;
              auVar28._8_4_ = auVar28._12_4_;
              auVar23 = pshuflw(auVar52,auVar28,0xe8);
              auVar29._0_4_ = auVar29._4_4_;
              auVar29._8_4_ = auVar29._12_4_;
              auVar18 = pshuflw(auVar49,auVar29,0xe8);
              auVar53._8_4_ = 0xffffffff;
              auVar53._0_8_ = 0xffffffffffffffff;
              auVar53._12_4_ = 0xffffffff;
              auVar49 = (auVar18 | auVar23 & auVar49) ^ auVar53;
              auVar49 = packssdw(auVar49,auVar49);
              auVar49 = packsswb(auVar49,auVar49);
              if ((auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar4[-0x5b] = 0x7c;
              }
              auVar29 = auVar28 & auVar38 | auVar29;
              auVar49 = packssdw(auVar29,auVar29);
              auVar49 = packssdw(auVar49 ^ auVar53,auVar49 ^ auVar53);
              auVar49 = packsswb(auVar49,auVar49);
              if ((auVar49._8_2_ >> 8 & 1) != 0) {
                puVar4[-0x4e] = 0x7c;
              }
              auVar49 = (auVar15 | auVar55) ^ auVar34;
              iVar43 = -(uint)(iVar17 < auVar49._0_4_);
              auVar47._4_4_ = -(uint)(iVar20 < auVar49._4_4_);
              iVar48 = -(uint)(iVar21 < auVar49._8_4_);
              auVar47._12_4_ = -(uint)(iVar22 < auVar49._12_4_);
              auVar30._4_4_ = iVar43;
              auVar30._0_4_ = iVar43;
              auVar30._8_4_ = iVar48;
              auVar30._12_4_ = iVar48;
              auVar39._4_4_ = -(uint)(auVar49._4_4_ == iVar20);
              auVar39._12_4_ = -(uint)(auVar49._12_4_ == iVar22);
              auVar39._0_4_ = auVar39._4_4_;
              auVar39._8_4_ = auVar39._12_4_;
              auVar47._0_4_ = auVar47._4_4_;
              auVar47._8_4_ = auVar47._12_4_;
              auVar49 = auVar39 & auVar30 | auVar47;
              auVar49 = packssdw(auVar49,auVar49);
              auVar49 = packssdw(auVar49 ^ auVar53,auVar49 ^ auVar53);
              auVar49 = packsswb(auVar49,auVar49);
              if ((auVar49 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar4[-0x41] = 0x7c;
              }
              auVar18 = pshufhw(auVar30,auVar30,0x84);
              auVar24 = pshufhw(auVar39,auVar39,0x84);
              auVar23 = pshufhw(auVar18,auVar47,0x84);
              auVar18 = (auVar23 | auVar24 & auVar18) ^ auVar53;
              auVar18 = packssdw(auVar18,auVar18);
              auVar18 = packsswb(auVar18,auVar18);
              if ((auVar18._10_2_ >> 8 & 1) != 0) {
                puVar4[-0x34] = 0x7c;
              }
              auVar18 = (auVar15 | auVar54) ^ auVar34;
              iVar43 = -(uint)(iVar17 < auVar18._0_4_);
              auVar32._4_4_ = -(uint)(iVar20 < auVar18._4_4_);
              iVar48 = -(uint)(iVar21 < auVar18._8_4_);
              auVar32._12_4_ = -(uint)(iVar22 < auVar18._12_4_);
              auVar40._4_4_ = iVar43;
              auVar40._0_4_ = iVar43;
              auVar40._8_4_ = iVar48;
              auVar40._12_4_ = iVar48;
              auVar49 = pshuflw(auVar49,auVar40,0xe8);
              auVar31._4_4_ = -(uint)(auVar18._4_4_ == iVar20);
              auVar31._12_4_ = -(uint)(auVar18._12_4_ == iVar22);
              auVar31._0_4_ = auVar31._4_4_;
              auVar31._8_4_ = auVar31._12_4_;
              auVar23 = pshuflw(auVar53,auVar31,0xe8);
              auVar32._0_4_ = auVar32._4_4_;
              auVar32._8_4_ = auVar32._12_4_;
              auVar18 = pshuflw(auVar49,auVar32,0xe8);
              in_XMM7._8_4_ = 0xffffffff;
              in_XMM7._0_8_ = 0xffffffffffffffff;
              in_XMM7._12_4_ = 0xffffffff;
              auVar49 = (auVar18 | auVar23 & auVar49) ^ in_XMM7;
              auVar49 = packssdw(auVar49,auVar49);
              auVar49 = packsswb(auVar49,auVar49);
              if ((auVar49 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar4[-0x27] = 0x7c;
              }
              auVar32 = auVar31 & auVar40 | auVar32;
              auVar18 = packssdw(auVar32,auVar32);
              auVar18 = packssdw(auVar18 ^ in_XMM7,auVar18 ^ in_XMM7);
              auVar18 = packsswb(auVar18,auVar18);
              if ((auVar18._12_2_ >> 8 & 1) != 0) {
                puVar4[-0x1a] = 0x7c;
              }
              auVar15 = (auVar15 | auVar44) ^ auVar34;
              auVar41._0_4_ = -(uint)(iVar17 < auVar15._0_4_);
              auVar41._4_4_ = -(uint)(iVar20 < auVar15._4_4_);
              auVar41._8_4_ = -(uint)(iVar21 < auVar15._8_4_);
              auVar41._12_4_ = -(uint)(iVar22 < auVar15._12_4_);
              auVar33._4_4_ = auVar41._0_4_;
              auVar33._0_4_ = auVar41._0_4_;
              auVar33._8_4_ = auVar41._8_4_;
              auVar33._12_4_ = auVar41._8_4_;
              auVar16._4_4_ = -(uint)(auVar15._4_4_ == iVar20);
              auVar16._12_4_ = -(uint)(auVar15._12_4_ == iVar22);
              auVar16._0_4_ = auVar16._4_4_;
              auVar16._8_4_ = auVar16._12_4_;
              auVar19._4_4_ = auVar41._4_4_;
              auVar19._0_4_ = auVar41._4_4_;
              auVar19._8_4_ = auVar41._12_4_;
              auVar19._12_4_ = auVar41._12_4_;
              auVar15 = packssdw(auVar41,auVar16 & auVar33 | auVar19);
              auVar15 = packssdw(auVar15 ^ in_XMM7,auVar15 ^ in_XMM7);
              auVar15 = packsswb(auVar15,auVar15);
              if ((auVar15 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar4[-0xd] = 0x7c;
              }
              auVar23 = pshufhw(auVar33,auVar33,0x84);
              auVar15 = pshufhw(auVar16,auVar16,0x84);
              auVar18 = pshufhw(auVar19,auVar19,0x84);
              auVar15 = packssdw(auVar15 & auVar23,(auVar18 | auVar15 & auVar23) ^ in_XMM7);
              auVar15 = packsswb(auVar15,auVar15);
              if ((auVar15._14_2_ >> 8 & 1) != 0) {
                *puVar4 = 0x7c;
              }
              uVar8 = uVar8 + 0x10;
              puVar4 = puVar4 + 0xd0;
            } while (((long)(int)~uVar3 + (long)(int)uVar10 + 0xfU & 0xfffffffffffffff0) != uVar8);
          }
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar1 >> 1);
  }
  lVar6 = 0;
  do {
    lVar11 = -0xd;
    do {
      putchar((int)(char)puVar9[lVar11 + 0xd]);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0);
    lVar6 = lVar6 + 1;
    putchar(10);
    puVar9 = puVar9 + 0xd;
  } while (lVar6 != 0xd);
  puts("\n\n=================================\n");
  return;
}

Assistant:

void Abc_GraphPathPrint4( int * pBuffer, Vec_Int_t * vEdges )
{
    char Box[13][13];
    int x, y;
    int e, nEdges = Vec_IntSize(vEdges)/2;
    for ( y = 0; y < 13; y++ )
    for ( x = 0; x < 13; x++ )
        if ( y % 4 == 0 && x % 4 == 0 )
            Box[y][x] = '*';
        else
            Box[y][x] = ' ';
    for ( e = 0; e < nEdges; e++ )
    {
        int * pNodes = Vec_IntEntryP(vEdges, 2*e);
        int y0 = 4*(pNodes[0]/4);
        int x0 = 4*(pNodes[0]%4);
        int y1 = 4*(pNodes[1]/4);
        int x1 = 4*(pNodes[1]%4);
        if ( !pBuffer[e] )
            continue;
        if ( y0 == y1 )
        {
            for ( x = x0+1; x < x1; x++ )
                Box[y0][x] = '-';
        }
        else if ( x0 == x1 )
        {
            for ( y = y0+1; y < y1; y++ )
                Box[y][x0] = '|';
        }
        else assert( 0 );
    }
    for ( y = 0; y < 13; y++, printf("\n") )
    for ( x = 0; x < 13; x++ )
        printf( "%c", Box[y][x] );
    printf( "\n\n=================================\n\n" );
}